

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

int session_nonblock(libssh2_socket_t sockfd,int nonblock)

{
  uint uVar1;
  int flags;
  int nonblock_local;
  libssh2_socket_t sockfd_local;
  
  uVar1 = fcntl(sockfd,3,0);
  if (nonblock == 0) {
    nonblock_local = fcntl(sockfd,4,(ulong)(uVar1 & 0xfffff7ff));
  }
  else {
    nonblock_local = fcntl(sockfd,4,(ulong)(uVar1 | 0x800));
  }
  return nonblock_local;
}

Assistant:

static int
session_nonblock(libssh2_socket_t sockfd,   /* operate on this */
                 int nonblock /* TRUE or FALSE */ )
{
#ifdef HAVE_O_NONBLOCK
    /* most recent unix versions */
    int flags;

    flags = fcntl(sockfd, F_GETFL, 0);
    if(nonblock)
        return fcntl(sockfd, F_SETFL, flags | O_NONBLOCK);
    else
        return fcntl(sockfd, F_SETFL, flags & (~O_NONBLOCK));
#elif defined(HAVE_FIONBIO)
    /* older unix versions and VMS */
    int flags;

    flags = nonblock;
    return ioctl(sockfd, FIONBIO, &flags);
#elif defined(HAVE_IOCTLSOCKET_CASE)
    /* presumably for Amiga */
    return IoctlSocket(sockfd, FIONBIO, (long) nonblock);
#elif defined(HAVE_SO_NONBLOCK)
    /* BeOS */
    long b = nonblock ? 1 : 0;
    return setsockopt(sockfd, SOL_SOCKET, SO_NONBLOCK, &b, sizeof(b));
#elif defined(_WIN32)
    unsigned long flags;

    flags = nonblock;
    return ioctlsocket(sockfd, FIONBIO, &flags);
#else
    (void)sockfd;
    (void)nonblock;
    return 0;                   /* returns success */
#endif
}